

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

void log_tap_result(int test_count,char *test,int status,process_info_t *process)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char reason [1024];
  char local_428 [1032];
  
  pcVar4 = "";
  pcVar5 = "ok";
  if (status != 0) {
    if (status == 1) {
      lVar2 = process_output_size(process);
      if (0 < lVar2) {
        process_read_last_line(process,local_428,0x400);
        sVar3 = strlen(local_428);
        pcVar4 = " # SKIP ";
        pcVar5 = "ok";
        if ((0 < (int)sVar3) && (uVar1 = (int)sVar3 - 1, local_428[uVar1] == '\n')) {
          local_428[uVar1] = '\0';
        }
        goto LAB_0010da2a;
      }
      pcVar4 = " # SKIP ";
    }
    else {
      pcVar5 = "not ok";
    }
  }
  local_428[0] = '\0';
LAB_0010da2a:
  fprintf(_stderr,"%s %d - %s%s%s\n",pcVar5,test_count,test,pcVar4,local_428);
  fflush(_stderr);
  return;
}

Assistant:

void log_tap_result(int test_count,
                    const char* test,
                    int status,
                    process_info_t* process) {
  const char* result;
  const char* directive;
  char reason[1024];
  int reason_length;

  switch (status) {
  case TEST_OK:
    result = "ok";
    directive = "";
    break;
  case TEST_SKIP:
    result = "ok";
    directive = " # SKIP ";
    break;
  default:
    result = "not ok";
    directive = "";
  }

  if (status == TEST_SKIP && process_output_size(process) > 0) {
    process_read_last_line(process, reason, sizeof reason);
    reason_length = strlen(reason);
    if (reason_length > 0 && reason[reason_length - 1] == '\n')
      reason[reason_length - 1] = '\0';
  } else {
    reason[0] = '\0';
  }

  fprintf(stderr, "%s %d - %s%s%s\n", result, test_count, test, directive, reason);
  fflush(stderr);
}